

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentedMap.hpp
# Opt level: O1

void __thiscall
binlog::detail::SegmentedMap<binlog::EventSource>::emplace<binlog::EventSource>
          (SegmentedMap<binlog::EventSource> *this,key_type key,EventSource *args)

{
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *this_00;
  pointer pEVar1;
  pointer puVar2;
  pointer pvVar3;
  pointer pEVar4;
  uint64_t uVar5;
  ulong uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  long lVar10;
  bool bVar12;
  initializer_list<binlog::EventSource> __l;
  allocator_type local_109;
  undefined1 local_108 [16];
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  uint64_t local_98;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  key_type local_50;
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> local_48;
  ulong uVar11;
  
  puVar2 = (this->_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(this->_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
  if (uVar6 < 2) {
    lVar10 = 0;
  }
  else {
    uVar9 = 1;
    do {
      uVar11 = uVar9;
      if (key < puVar2[uVar9]) break;
      uVar9 = uVar9 + 1;
      uVar11 = uVar6;
    } while (uVar6 != uVar9);
    lVar10 = uVar11 - 1;
  }
  uVar9 = key - puVar2[lVar10];
  this_00 = (this->_segments).
            super__Vector_base<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar10;
  uVar6 = ((long)(this_00->
                 super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this_00->
                 super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859;
  bVar12 = uVar6 - uVar9 == 0;
  local_50 = key;
  if (bVar12) {
    std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::
    emplace_back<binlog::EventSource>(this_00,args);
    return;
  }
  if (uVar6 < uVar9 || bVar12) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
              (&this->_offsets,(const_iterator)(puVar2 + lVar10 + 1),&local_50);
    pvVar3 = (this->_segments).
             super__Vector_base<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_108._8_2_ = args->severity;
    local_108._0_8_ = args->id;
    local_f8._M_p = (args->category)._M_dataplus._M_p;
    paVar7 = &(args->category).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p == paVar7) {
      local_e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_e8._8_8_ = *(undefined8 *)((long)&(args->category).field_2 + 8);
      local_f8._M_p = (pointer)&local_e8;
    }
    else {
      local_e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_f0 = (args->category)._M_string_length;
    (args->category)._M_dataplus._M_p = (pointer)paVar7;
    (args->category)._M_string_length = 0;
    (args->category).field_2._M_local_buf[0] = '\0';
    local_d8._M_p = (args->function)._M_dataplus._M_p;
    paVar7 = &(args->function).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p == paVar7) {
      local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_c8._8_8_ = *(undefined8 *)((long)&(args->function).field_2 + 8);
      local_d8._M_p = (pointer)&local_c8;
    }
    else {
      local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_d0 = (args->function)._M_string_length;
    (args->function)._M_dataplus._M_p = (pointer)paVar7;
    (args->function)._M_string_length = 0;
    (args->function).field_2._M_local_buf[0] = '\0';
    local_b8._M_p = (args->file)._M_dataplus._M_p;
    paVar7 = &(args->file).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p == paVar7) {
      local_a8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_a8._8_8_ = *(undefined8 *)((long)&(args->file).field_2 + 8);
      local_b8._M_p = (pointer)&local_a8;
    }
    else {
      local_a8._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_b0 = (args->file)._M_string_length;
    (args->file)._M_dataplus._M_p = (pointer)paVar7;
    (args->file)._M_string_length = 0;
    (args->file).field_2._M_local_buf[0] = '\0';
    local_98 = args->line;
    local_90._M_p = (pointer)&local_80;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(args->formatString)._M_dataplus._M_p;
    paVar8 = &(args->formatString).field_2;
    if (paVar7 == paVar8) {
      local_80._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_80._8_8_ = *(undefined8 *)((long)&(args->formatString).field_2 + 8);
    }
    else {
      local_80._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_90._M_p = (pointer)paVar7;
    }
    local_88 = (args->formatString)._M_string_length;
    (args->formatString)._M_dataplus._M_p = (pointer)paVar8;
    (args->formatString)._M_string_length = 0;
    (args->formatString).field_2._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(args->argumentTags)._M_dataplus._M_p;
    paVar8 = &(args->argumentTags).field_2;
    if (paVar7 == paVar8) {
      local_60._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_60._8_8_ = *(undefined8 *)((long)&(args->argumentTags).field_2 + 8);
    }
    else {
      local_60._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_70._M_p = (pointer)paVar7;
    }
    local_68 = (args->argumentTags)._M_string_length;
    (args->argumentTags)._M_dataplus._M_p = (pointer)paVar8;
    (args->argumentTags)._M_string_length = 0;
    (args->argumentTags).field_2._M_local_buf[0] = '\0';
    __l._M_len = 1;
    __l._M_array = (iterator)local_108;
    std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::vector
              (&local_48,__l,&local_109);
    std::
    vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
    ::_M_insert_rval(&this->_segments,pvVar3 + lVar10 + 1,&local_48);
    std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p == &local_e8) {
      return;
    }
  }
  else {
    local_108._8_2_ = args->severity;
    local_f8._M_p = (pointer)&local_e8;
    local_108._0_8_ = args->id;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(args->category)._M_dataplus._M_p;
    paVar7 = &(args->category).field_2;
    if (paVar8 == paVar7) {
      local_e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_e8._8_8_ = *(undefined8 *)((long)&(args->category).field_2 + 8);
    }
    else {
      local_e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_f8._M_p = (pointer)paVar8;
    }
    local_f0 = (args->category)._M_string_length;
    local_d8._M_p = (pointer)&local_c8;
    (args->category)._M_dataplus._M_p = (pointer)paVar7;
    (args->category)._M_string_length = 0;
    (args->category).field_2._M_local_buf[0] = '\0';
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(args->function)._M_dataplus._M_p;
    paVar7 = &(args->function).field_2;
    if (paVar8 == paVar7) {
      local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_c8._8_8_ = *(undefined8 *)((long)&(args->function).field_2 + 8);
    }
    else {
      local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_d8._M_p = (pointer)paVar8;
    }
    local_d0 = (args->function)._M_string_length;
    local_b8._M_p = (pointer)&local_a8;
    (args->function)._M_dataplus._M_p = (pointer)paVar7;
    (args->function)._M_string_length = 0;
    (args->function).field_2._M_local_buf[0] = '\0';
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(args->file)._M_dataplus._M_p;
    paVar7 = &(args->file).field_2;
    if (paVar8 == paVar7) {
      local_a8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_a8._8_8_ = *(undefined8 *)((long)&(args->file).field_2 + 8);
    }
    else {
      local_a8._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_b8._M_p = (pointer)paVar8;
    }
    local_b0 = (args->file)._M_string_length;
    (args->file)._M_dataplus._M_p = (pointer)paVar7;
    (args->file)._M_string_length = 0;
    (args->file).field_2._M_local_buf[0] = '\0';
    local_98 = args->line;
    local_90._M_p = (args->formatString)._M_dataplus._M_p;
    paVar7 = &(args->formatString).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p == paVar7) {
      local_80._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_80._8_8_ = *(undefined8 *)((long)&(args->formatString).field_2 + 8);
      local_90._M_p = (pointer)&local_80;
    }
    else {
      local_80._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_88 = (args->formatString)._M_string_length;
    (args->formatString)._M_dataplus._M_p = (pointer)paVar7;
    (args->formatString)._M_string_length = 0;
    (args->formatString).field_2._M_local_buf[0] = '\0';
    local_70._M_p = (args->argumentTags)._M_dataplus._M_p;
    paVar7 = &(args->argumentTags).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p == paVar7) {
      local_60._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_60._8_8_ = *(undefined8 *)((long)&(args->argumentTags).field_2 + 8);
      local_70._M_p = (pointer)&local_60;
    }
    else {
      local_60._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_68 = (args->argumentTags)._M_string_length;
    (args->argumentTags)._M_dataplus._M_p = (pointer)paVar7;
    (args->argumentTags)._M_string_length = 0;
    (args->argumentTags).field_2._M_local_buf[0] = '\0';
    pEVar4 = (this_00->super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = args->id;
    pEVar1 = pEVar4 + uVar9;
    pEVar1->severity = args->severity;
    pEVar1->id = uVar5;
    std::__cxx11::string::operator=((string *)&pEVar1->category,(string *)&local_f8);
    std::__cxx11::string::operator=((string *)&pEVar4[uVar9].function,(string *)&local_d8);
    std::__cxx11::string::operator=((string *)&pEVar4[uVar9].file,(string *)&local_b8);
    pEVar4[uVar9].line = local_98;
    std::__cxx11::string::operator=((string *)&pEVar4[uVar9].formatString,(string *)&local_90);
    std::__cxx11::string::operator=((string *)&pEVar4[uVar9].argumentTags,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p == &local_e8) {
      return;
    }
  }
  operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  return;
}

Assistant:

void emplace(const key_type key, Args&&... args)
  {
    const key_type si = segmentIndex(key);
    const key_type offset = _offsets[si];
    const key_type vi = key - offset;
    Segment& segment = _segments[si];

    if (segment.size() == vi)
    {
      segment.emplace_back(std::forward<Args>(args)...);
    }
    else if (segment.size() > vi)
    {
      segment[vi] = mapped_type(std::forward<Args>(args)...);
    }
    else
    {
      const auto ito = std::vector<key_type>::iterator::difference_type(si + 1);
      _offsets.insert(_offsets.begin() + ito, key);
      _segments.emplace(_segments.begin() + ito, Segment{mapped_type(std::forward<Args>(args)...)});
    }
  }